

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::scalarString(Output *this,StringRef *S,QuotingType MustQuote)

{
  StringRef s;
  bool bVar1;
  char cVar2;
  size_t sVar3;
  undefined1 in_R8B;
  StringRef Input;
  char *local_130;
  StringRef local_120;
  StringRef local_110;
  StringLiteral local_100;
  char *local_f0;
  size_t local_e8;
  StringRef local_e0;
  char *local_d0;
  char *Base;
  uint local_c0;
  uint End;
  uint j;
  uint i;
  yaml *local_98;
  ulong uStack_90;
  string local_88;
  StringRef local_68;
  StringRef local_58;
  char *local_48;
  char *Quote;
  size_t local_38;
  StringRef local_30;
  QuotingType local_1c;
  StringRef *pSStack_18;
  QuotingType MustQuote_local;
  StringRef *S_local;
  Output *this_local;
  
  local_1c = MustQuote;
  pSStack_18 = S;
  S_local = (StringRef *)this;
  newLineCheck(this);
  bVar1 = StringRef::empty(pSStack_18);
  if (bVar1) {
    StringRef::StringRef(&local_30,"\'\'");
    outputUpToEndOfLine(this,local_30);
  }
  else if (local_1c == None) {
    Quote = pSStack_18->Data;
    local_38 = pSStack_18->Length;
    outputUpToEndOfLine(this,*pSStack_18);
  }
  else {
    if (local_1c == Single) {
      local_130 = "\'";
    }
    else {
      local_130 = "\"";
    }
    local_48 = local_130;
    StringRef::StringRef(&local_58,local_130);
    output(this,local_58);
    if (local_1c == Double) {
      local_98 = (yaml *)pSStack_18->Data;
      uStack_90 = pSStack_18->Length;
      Input.Length = 0;
      Input.Data = (char *)uStack_90;
      escape_abi_cxx11_(&local_88,local_98,Input,(bool)in_R8B);
      StringRef::StringRef(&local_68,&local_88);
      output(this,local_68);
      std::__cxx11::string::~string((string *)&local_88);
      StringRef::StringRef((StringRef *)&j,local_48);
      outputUpToEndOfLine(this,_j);
    }
    else {
      End = 0;
      local_c0 = 0;
      sVar3 = StringRef::size(pSStack_18);
      Base._4_4_ = (uint)sVar3;
      local_d0 = StringRef::data(pSStack_18);
      for (; local_c0 < Base._4_4_; local_c0 = local_c0 + 1) {
        cVar2 = StringRef::operator[](pSStack_18,(ulong)local_c0);
        if (cVar2 == '\'') {
          StringRef::StringRef(&local_e0,local_d0 + End,(ulong)(local_c0 - End));
          output(this,local_e0);
          StringLiteral::StringLiteral<3UL>(&local_100,(char (*) [3])"\'\'");
          local_f0 = local_100.super_StringRef.Data;
          local_e8 = local_100.super_StringRef.Length;
          s.Length = local_100.super_StringRef.Length;
          s.Data = local_100.super_StringRef.Data;
          output(this,s);
          End = local_c0 + 1;
        }
      }
      StringRef::StringRef(&local_110,local_d0 + End,(ulong)(local_c0 - End));
      output(this,local_110);
      StringRef::StringRef(&local_120,local_48);
      outputUpToEndOfLine(this,local_120);
    }
  }
  return;
}

Assistant:

void Output::scalarString(StringRef &S, QuotingType MustQuote) {
  newLineCheck();
  if (S.empty()) {
    // Print '' for the empty string because leaving the field empty is not
    // allowed.
    outputUpToEndOfLine("''");
    return;
  }
  if (MustQuote == QuotingType::None) {
    // Only quote if we must.
    outputUpToEndOfLine(S);
    return;
  }

  const char *const Quote = MustQuote == QuotingType::Single ? "'" : "\"";
  output(Quote); // Starting quote.

  // When using double-quoted strings (and only in that case), non-printable characters may be
  // present, and will be escaped using a variety of unicode-scalar and special short-form
  // escapes. This is handled in yaml::escape.
  if (MustQuote == QuotingType::Double) {
    output(yaml::escape(S, /* EscapePrintable= */ false));
    outputUpToEndOfLine(Quote);
    return;
  }

  unsigned i = 0;
  unsigned j = 0;
  unsigned End = S.size();
  const char *Base = S.data();

  // When using single-quoted strings, any single quote ' must be doubled to be escaped.
  while (j < End) {
    if (S[j] == '\'') {                    // Escape quotes.
      output(StringRef(&Base[i], j - i));  // "flush".
      output(StringLiteral("''"));         // Print it as ''
      i = j + 1;
    }
    ++j;
  }
  output(StringRef(&Base[i], j - i));
  outputUpToEndOfLine(Quote); // Ending quote.
}